

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void outchar_noxlat_stream(out_stream_info *stream,char c)

{
  char *__dest;
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  mcmcxdef *cctx;
  ushort **ppuVar4;
  __int32_t **pp_Var5;
  uchar *puVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  uchar uVar10;
  ulong uVar11;
  uchar uVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  char tmpbuf [2048];
  int tmpattr [2048];
  
  uVar8 = 0x20;
  if (((c != '\x1a') && (uVar8 = 9, c != '\x19')) && (uVar8 = (ulong)(byte)c, -1 < c)) {
    ppuVar4 = __ctype_b_loc();
    uVar8 = 0x20;
    if ((*(byte *)((long)*ppuVar4 + (ulong)(byte)c * 2 + 1) & 0x20) == 0) {
      uVar8 = (ulong)(byte)c;
    }
  }
  if (((stream->capsflag != '\0') || (stream->allcapsflag != '\0')) && (-1 < (char)uVar8)) {
    ppuVar4 = __ctype_b_loc();
    if (((*ppuVar4)[uVar8] >> 10 & 1) != 0) {
      if (((*ppuVar4)[uVar8] >> 9 & 1) != 0) {
        pp_Var5 = __ctype_toupper_loc();
        uVar8 = (ulong)*(byte *)(*pp_Var5 + uVar8);
      }
      stream->capsflag = '\0';
      goto LAB_0021a888;
    }
  }
  if ((stream->nocapsflag != '\0') && (-1 < (char)uVar8)) {
    ppuVar4 = __ctype_b_loc();
    if (((*ppuVar4)[uVar8] >> 10 & 1) != 0) {
      if (((*ppuVar4)[uVar8] >> 8 & 1) != 0) {
        pp_Var5 = __ctype_tolower_loc();
        uVar8 = (ulong)*(byte *)(*pp_Var5 + uVar8);
      }
      stream->nocapsflag = '\0';
    }
  }
LAB_0021a888:
  uVar12 = (uchar)uVar8;
  if (stream->capturing == 0) {
    bVar13 = stream->linecol;
    if ((int)(bVar13 + 1) < G_os_linewidth) {
      if (-1 < (char)uVar12) {
        ppuVar4 = __ctype_b_loc();
        bVar16 = (*(byte *)((long)*ppuVar4 + uVar8 * 2 + 1) & 0x20) == 0;
        if (((c == '\x1a') || (bVar13 != 0)) || (uVar12 == '\t' || bVar16)) {
          if (((bVar13 != 0 && c != '\x1a') && (uVar12 != '\t' && !bVar16)) &&
             (stream->html_pre_level == 0)) {
            bVar2 = stream->linepos;
            uVar8 = (ulong)bVar2;
            uVar11 = (ulong)stream->linebuf[uVar8 - 1];
            if ((-1 < (long)uVar11) && ((*(byte *)((long)*ppuVar4 + uVar11 * 2 + 1) & 0x20) != 0)) {
              return;
            }
            uVar9 = uVar8;
            if (doublespace != 0) {
              while( true ) {
                uVar14 = (uint)uVar11 & 0xff;
                if (uVar9 == 1) break;
                switch(uVar14) {
                case 0x21:
                  goto switchD_0021ab4e_caseD_21;
                case 0x22:
                case 0x27:
                case 0x29:
                  break;
                case 0x23:
                case 0x24:
                case 0x25:
                case 0x26:
                case 0x28:
                  goto switchD_0021ab4e_caseD_23;
                default:
                  if ((uVar14 != 0x5d) && (uVar14 != 0x7d)) {
                    if ((uVar14 == 0x2e) || ((uVar14 == 0x3a || (uVar14 == 0x3f))))
                    goto switchD_0021ab4e_caseD_21;
                    goto switchD_0021ab4e_caseD_23;
                  }
                }
                uVar11 = (ulong)(byte)stream->linebuf[uVar9 - 2];
                uVar9 = uVar9 - 1;
              }
              if (((byte)uVar11 < 0x40) && ((0x8400400200000000U >> (uVar11 & 0x3f) & 1) != 0)) {
switchD_0021ab4e_caseD_21:
                stream->attrbuf[uVar8] = stream->cur_attr;
                stream->linepos = bVar2 + 1;
                stream->linebuf[uVar8] = uVar12;
                bVar13 = bVar13 + 1;
              }
            }
          }
        }
        else {
          if (stream->html_pre_level == 0) {
            return;
          }
          bVar13 = 0;
        }
      }
switchD_0021ab4e_caseD_23:
      bVar2 = stream->linepos;
      stream->attrbuf[bVar2] = stream->cur_attr;
      stream->linepos = bVar2 + 1;
      stream->linebuf[bVar2] = uVar12;
      stream->linecol = bVar13 + 1;
    }
    else {
      if ((char)uVar12 < '\0') {
        uVar8 = (ulong)stream->linepos;
        uVar14 = stream->linepos - 1;
      }
      else {
        ppuVar4 = __ctype_b_loc();
        if (((c != '\x1a') && (((*ppuVar4)[uVar8] & 0x2000) != 0)) && (uVar12 != '\t')) {
          bVar13 = stream->linepos;
          if (stream->linebuf[(ulong)bVar13 - 1] == ' ') {
            return;
          }
          stream->attrbuf[bVar13] = stream->cur_attr;
          stream->linepos = bVar13 + 1;
          stream->linebuf[bVar13] = ' ';
          return;
        }
        uVar8 = (ulong)stream->linepos;
        uVar14 = stream->linepos - 1;
        if (uVar12 == '-') {
          for (; (uVar15 = 0xffffffff, -1 < (int)uVar14 &&
                 (uVar15 = uVar14, stream->linebuf[uVar14] == '-')); uVar14 = uVar14 - 1) {
          }
          while (((uVar14 = 0xffffffff, -1 < (int)uVar15 &&
                  (uVar14 = uVar15, -1 < (long)stream->linebuf[uVar15])) &&
                 ((*(byte *)((long)*ppuVar4 + (long)stream->linebuf[uVar15] * 2 + 1) & 0x20) != 0)))
          {
            uVar15 = uVar15 - 1;
          }
        }
      }
      __dest = stream->linebuf;
      uVar11 = (ulong)(uVar14 + 1);
LAB_0021ab78:
      if ((int)uVar14 < 0) {
        sVar7 = 0;
        out_flushline(stream,0);
        stream->linebuf[0] = '\0';
        uVar10 = '\x01';
      }
      else {
        bVar13 = __dest[uVar14];
        if ((((long)(char)bVar13 < 0) ||
            (ppuVar4 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar4 + (long)(char)bVar13 * 2 + 1) & 0x20) == 0)) &&
           ((bVar13 != 0x2d || (stream->os_line_wrap != 0)))) goto LAB_0021abb0;
        uVar10 = '\0';
        stream->linebuf[uVar8] = '\0';
        sVar7 = strlen(__dest + uVar11);
        memcpy(tmpbuf,__dest + uVar11,sVar7 + 1);
        memcpy(tmpattr,stream->attrbuf + uVar11,sVar7 * 4);
        ppuVar4 = __ctype_b_loc();
        uVar8 = (ulong)uVar14;
        if (((*ppuVar4)[bVar13] >> 0xd & 1) == 0) {
          uVar8 = uVar11;
        }
        stream->linebuf[uVar8] = '\0';
        out_flushline(stream,1);
        memcpy(__dest,tmpbuf,sVar7 + 1);
        memcpy(stream->attrbuf,tmpattr,sVar7 * 4);
        for (uVar8 = 0; (sVar7 & 0xff) != uVar8; uVar8 = uVar8 + 1) {
          if (0x19 < (byte)__dest[uVar8]) {
            uVar10 = uVar10 + '\x01';
            stream->linecol = uVar10;
          }
        }
        uVar10 = uVar10 + '\x01';
      }
      stream->attrbuf[sVar7 & 0xff] = stream->cur_attr;
      stream->linepos = (char)sVar7 + '\x01';
      stream->linebuf[sVar7 & 0xff] = uVar12;
      stream->linecol = uVar10;
    }
  }
  else if (stream->capture_obj != 0xffff) {
    puVar6 = mcmlck(stream->capture_ctx,stream->capture_obj);
    cctx = stream->capture_ctx;
    uVar3 = stream->capture_obj;
    uVar14 = stream->capture_ofs;
    if (*(ushort *)
         ((long)&cctx->mcmcxgl->mcmcxtab[cctx->mcmcxmtb[uVar3 >> 8][uVar3 & 0xff] >> 8]->mcmosiz +
         (ulong)((cctx->mcmcxmtb[uVar3 >> 8][uVar3 & 0xff] & 0xff) << 5)) <= uVar14) {
      puVar6 = mcmrealo(cctx,uVar3,(short)uVar14 + 0x100);
      uVar14 = stream->capture_ofs;
    }
    stream->capture_ofs = uVar14 + 1;
    puVar6[uVar14] = uVar12;
    uVar3 = stream->capture_ctx->mcmcxmtb[stream->capture_obj >> 8][stream->capture_obj & 0xff];
    puVar1 = (ushort *)
             ((long)&stream->capture_ctx->mcmcxgl->mcmcxtab[uVar3 >> 8]->mcmoflg +
             (ulong)((uVar3 & 0xff) << 5));
    *puVar1 = *puVar1 | 1;
    mcmunlck(stream->capture_ctx,stream->capture_obj);
    return;
  }
  return;
LAB_0021abb0:
  uVar14 = uVar14 - 1;
  uVar11 = uVar11 - 1;
  goto LAB_0021ab78;
}

Assistant:

static void outchar_noxlat_stream(out_stream_info *stream, char c)
{
    int  i;
    int  qspace;
    
    /* check for the special quoted space character */
    if (c == QSPACE)
    {
        /* it's a quoted space - note it and convert it to a regular space */
        qspace = 1;
        c = ' ';
    }
    else if (c == QTAB)
    {
        /* it's a hard tab - convert it to an ordinary tab */
        c = '\t';
        qspace = 0;
    }
    else
    {
        /* translate any whitespace character to a regular space character */
        if (outissp(c))
            c = ' ';
        
        /* it's not a quoted space */
        qspace = 0;
    }

    /* check for the caps/nocaps flags */
    if ((stream->capsflag || stream->allcapsflag) && outisal(c))
    {
        /* capsflag is set, so capitalize this character */
        if (outislo(c))
            c = toupper(c);

        /* okay, we've capitalized something; clear flag */
        stream->capsflag = 0;
    }
    else if (stream->nocapsflag && outisal(c))
    {
        /* nocapsflag is set, so minisculize this character */
        if (outisup(c))
            c = tolower(c);

        /* clear the flag now that we've done the job */
        stream->nocapsflag = 0;
    }

    /* if in capture mode, simply capture the character */
    if (stream->capturing)
    {
        uchar *p;

        /* if we have a valid capture object, copy to it */
        if (stream->capture_obj != MCMONINV)
        {
            /* lock the object holding the captured text */
            p = mcmlck(stream->capture_ctx, stream->capture_obj);
            
            /* make sure the capture object is big enough */
            if (mcmobjsiz(stream->capture_ctx, stream->capture_obj)
                <= stream->capture_ofs)
            {
                /* expand the object by another 256 bytes */
                p = mcmrealo(stream->capture_ctx, stream->capture_obj,
                             (ushort)(stream->capture_ofs + 256));
            }
            
            /* add this character */
            *(p + stream->capture_ofs++) = c;
            
            /* unlock the capture object */
            mcmtch(stream->capture_ctx, stream->capture_obj);
            mcmunlck(stream->capture_ctx, stream->capture_obj);
        }

        /*
         *   we're done - we don't want to actually display the character
         *   while capturing 
         */
        return;
    }

    /* add the character to out output buffer, flushing as needed */
    if (stream->linecol + 1 < G_os_linewidth)
    {
        /* 
         *   there's room for this character, so add it to the buffer 
         */
        
        /* ignore non-quoted space at start of line outside of PRE */
        if (outissp(c) && c != '\t' && stream->linecol == 0 && !qspace
            && stream->html_pre_level == 0)
            return;

        /* is this a non-quoted space not at the start of the line? */
        if (outissp(c) && c != '\t' && stream->linecol != 0 && !qspace
            && stream->html_pre_level == 0)
        {
            int  pos1 = stream->linepos - 1;
            char p = stream->linebuf[pos1];     /* check previous character */

            /* ignore repeated spaces - collapse into a single space */
            if (outissp(p))
                return;

            /*
             *   Certain punctuation requires a double space: a period, a
             *   question mark, an exclamation mark, or a colon; or any of
             *   these characters followed by any number of single and/or
             *   double quotes.  First, scan back to before any quotes, if
             *   are on one now, then check the preceding character; if
             *   it's one of the punctuation marks requiring a double
             *   space, add this space a second time.  (In addition to
             *   scanning back past quotes, scan past parentheses,
             *   brackets, and braces.)  Don't double the spacing if we're
             *   not in the normal doublespace mode; some people may
             *   prefer single spacing after punctuation, so we make this
             *   a run-time option.  
             */
            if (doublespace)
            {
                /* find the previous relevant punctuation character */
                while (pos1 &&
                       (p == '"' || p == '\'' || p == ')' || p == ']'
                        || p == '}'))
                {
                    p = stream->linebuf[--pos1];
                }
                if ( p == '.' || p == '?' || p == '!' || p == ':' )
                {
                    /* a double-space is required after this character */
                    stream->attrbuf[stream->linepos] = stream->cur_attr;
                    stream->linebuf[stream->linepos++] = c;
                    ++(stream->linecol);
                }
            }
        }

        /* add this character to the buffer */
        stream->attrbuf[stream->linepos] = stream->cur_attr;
        stream->linebuf[stream->linepos++] = c;

        /* advance the output column position */
        ++(stream->linecol);
        return;
    }

    /*
     *   The line would overflow if this character were added.  Find the
     *   most recent word break, and output the line up to the previous
     *   word.  Note that if we're trying to output a space, we'll just
     *   add it to the line buffer.  If the last character of the line
     *   buffer is already a space, we won't do anything right now.  
     */
    if (outissp(c) && c != '\t' && !qspace)
    {
        /* this is a space, so we're at a word break */
        if (stream->linebuf[stream->linepos - 1] != ' ')
        {
            stream->attrbuf[stream->linepos] = stream->cur_attr;
            stream->linebuf[stream->linepos++] = ' ';
        }
        return;
    }
    
    /*
     *   Find the most recent word break: look for a space or dash, starting
     *   at the end of the line.  
     *   
     *   If we're about to write a hyphen, we want to skip all contiguous
     *   hyphens, because we want to keep them together as a single
     *   punctuation mark; then keep going in the normal manner, which will
     *   keep the hyphens plus the word they're attached to together as a
     *   single unit.  If spaces precede the sequence of hyphens, include
     *   the prior word as well.  
     */
    i = stream->linepos - 1;
    if (c == '-')
    {
        /* skip any contiguous hyphens at the end of the line */
        for ( ; i >= 0 && stream->linebuf[i] == '-' ; --i) ;
        
        /* skip any spaces preceding the sequence of hyphens */
        for ( ; i >= 0 && outissp(stream->linebuf[i]) ; --i) ;
    }

    /* 
     *   Now find the preceding space.  If we're doing our own wrapping
     *   (i.e., we're not using OS line wrapping), then look for the
     *   nearest hyphen as well. 
     */
    for ( ; i >= 0 && !outissp(stream->linebuf[i])
          && !(!stream->os_line_wrap && stream->linebuf[i] == '-') ; --i) ;

    /* check to see if we found a good place to break */
    if (i < 0)
    {
        /* 
         *   we didn't find any good place to break - flush the entire
         *   line as-is, breaking arbitrarily in the middle of a word 
         */
        out_flushline(stream, FALSE);

        /* 
         *   we've completely cleared out the line buffer, so reset all of
         *   the line buffer counters 
         */
        stream->linepos = 0;
        stream->linecol = 0;
        stream->linebuf[0] = '\0';
    }
    else
    {
        char brkchar;
        char tmpbuf[MAXWIDTH];
        int tmpattr[MAXWIDTH];
        size_t tmpcnt;

        /* remember the word-break character */        
        brkchar = stream->linebuf[i];

        /* null-terminate the line buffer */        
        stream->linebuf[stream->linepos] = '\0';

        /* the next line starts after the break - save a copy */
        tmpcnt = strlen(&stream->linebuf[i+1]);
        memcpy(tmpbuf, &stream->linebuf[i+1], tmpcnt + 1);
        memcpy(tmpattr, &stream->attrbuf[i+1], tmpcnt * sizeof(tmpattr[0]));

        /* 
         *   terminate the buffer at the space or after the hyphen,
         *   depending on where we broke 
         */
        if (outissp(brkchar))
            stream->linebuf[i] = '\0';
        else
            stream->linebuf[i+1] = '\0';

        /* write out everything up to the word break */
        out_flushline(stream, TRUE);

        /* copy the next line into line buffer */
        memcpy(stream->linebuf, tmpbuf, tmpcnt + 1);
        memcpy(stream->attrbuf, tmpattr, tmpcnt * sizeof(tmpattr[0]));
        stream->linepos = tmpcnt;

        /* 
         *   figure what column we're now in - count all of the printable
         *   characters in the new line 
         */
        for (stream->linecol = 0, i = 0 ; i < stream->linepos ; ++i)
        {
            /* if it's printable, count it */
            if (((unsigned char)stream->linebuf[i]) >= 26)
                ++(stream->linecol);
        }
    }
    
    /* add the new character to buffer */
    stream->attrbuf[stream->linepos] = stream->cur_attr;
    stream->linebuf[stream->linepos++] = c;

    /* advance the column counter */
    ++(stream->linecol);
}